

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_statement.cpp
# Opt level: O0

unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
duckdb::SelectStatement::Deserialize(Deserializer *deserializer)

{
  pointer pSVar1;
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> *in_RSI;
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_> in_RDI;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_00000008;
  char *in_stack_00000010;
  field_id_t in_stack_0000001e;
  Deserializer *in_stack_00000020;
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> *result;
  pointer in_stack_ffffffffffffff98;
  SelectStatement *in_stack_ffffffffffffffa0;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
  *in_stack_ffffffffffffffa8;
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> *tag;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> this;
  
  this._M_head_impl =
       (SelectStatement *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  operator_new(0x80);
  SelectStatement(in_stack_ffffffffffffffa0);
  unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>::
  unique_ptr<std::default_delete<duckdb::SelectStatement>,void>
            ((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  tag = in_RSI;
  pSVar1 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)in_stack_ffffffffffffffa0);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
            ((Deserializer *)this._M_head_impl,(field_id_t)((ulong)pSVar1 >> 0x30),(char *)tag,
             in_stack_ffffffffffffffa8);
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
  operator->(in_RSI);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,unsigned_long,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>>
            (in_stack_00000020,in_stack_0000001e,in_stack_00000010,in_stack_00000008);
  return (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
         (__uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<SelectStatement> SelectStatement::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SelectStatement>(new SelectStatement());
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(100, "node", result->node);
	deserializer.ReadPropertyWithDefault<case_insensitive_map_t<idx_t>>(101, "named_param_map", result->named_param_map);
	return result;
}